

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merged-constraint.cpp
# Opt level: O1

vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_> *
baryonyx::itm::make_merged_constraints
          (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           *__return_storage_ptr__,context *ctx,problem *pb)

{
  pre_constraint_order *arg1;
  int iVar1;
  pointer pfVar2;
  pointer poVar3;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  __first;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  __last;
  function_element fVar4;
  double dVar5;
  double dVar6;
  function_element *pfVar7;
  pointer pmVar8;
  double *pdVar9;
  merged_constraint *cst;
  pointer pmVar10;
  pointer poVar11;
  size_t sVar12;
  uint uVar13;
  double *pdVar14;
  pointer ppVar15;
  function_element *pfVar16;
  tuple<double,_baryonyx::show_size_type> *mem;
  ulong uVar17;
  operator_type op;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  __i;
  pointer ppVar18;
  __normal_iterator<baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
  __last_00;
  pointer pfVar19;
  int *piVar20;
  function_element *pfVar21;
  ulong uVar22;
  long lVar23;
  operator_type oVar24;
  double *pdVar25;
  __normal_iterator<baryonyx::itm::merged_constraint_*,_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
  __i_2;
  pointer pmVar26;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_> *this;
  long lVar27;
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 in_ZMM2 [64];
  vector<double,_std::allocator<double>_> variable_cost;
  vector<int,_std::allocator<int>_> variable_constraint_degree;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> constraints_ratio_min;
  allocator_type local_e9;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  local_e8;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *local_c8;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  local_c0;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  size_t local_80;
  undefined1 auStack_78 [8];
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_70;
  undefined4 local_58 [2];
  double local_50;
  problem *local_48;
  context *local_40;
  long local_38;
  
  arg1 = &(ctx->parameters).pre_order;
  info<baryonyx::solver_parameters::pre_constraint_order>
            (ctx,"  - merge constraint according to the `{}` algorithm\n",arg1);
  local_38 = ((long)(pb->greater_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pb->greater_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
             ((long)(pb->less_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pb->less_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
             ((long)(pb->equal_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pb->equal_constraints).
                    super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  reserve(__return_storage_ptr__,(long)(int)local_38);
  auVar29 = in_ZMM2._0_16_;
  switch(*arg1) {
  case none:
    make_unsorted_merged_constraints(&local_e8,ctx,pb);
    local_a8._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_a8._8_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_98._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    this = &local_e8;
    break;
  case memory:
    make_unsorted_merged_constraints(&local_e8,ctx,pb);
    local_a8._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_a8._8_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_98._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_e8.
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_e8.
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_e8.
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)local_a8);
    goto LAB_005f3fea;
  case less_greater_equal:
  case less_equal_greater:
  case greater_less_equal:
  case greater_equal_less:
  case equal_less_greater:
  case equal_greater_less:
    local_a8._0_8_ = auStack_78;
    local_a8._8_8_ = (pointer)0x1;
    local_98._0_8_ = (_Hash_node_base *)0x0;
    local_98._8_8_ = 0;
    local_98._16_4_ = 1.0;
    local_80 = 0;
    auStack_78 = (undefined1  [8])0x0;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::reserve(&local_e8,
              ((long)(pb->greater_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pb->greater_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
              ((long)(pb->less_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pb->less_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
              ((long)(pb->equal_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pb->equal_constraints).
                     super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
    switch(*arg1) {
    case less_greater_equal:
      oVar24 = greater;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,less,pb,&local_e8);
      break;
    case less_equal_greater:
      oVar24 = equal;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,less,pb,&local_e8);
      goto LAB_005f3f07;
    case greater_less_equal:
      oVar24 = less;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,greater,pb,&local_e8);
      break;
    case greater_equal_less:
      oVar24 = equal;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,greater,pb,&local_e8);
      goto LAB_005f3f43;
    case equal_less_greater:
      oVar24 = less;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,equal,pb,&local_e8);
LAB_005f3f07:
      op = greater;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,oVar24,pb,&local_e8);
      goto LAB_005f3f60;
    case equal_greater_less:
      oVar24 = greater;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,equal,pb,&local_e8);
LAB_005f3f43:
      op = less;
      fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                      *)local_a8,oVar24,pb,&local_e8);
      goto LAB_005f3f60;
    default:
      goto switchD_005f3a5d_default;
    }
    op = equal;
    fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
              (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                    *)local_a8,oVar24,pb,&local_e8);
LAB_005f3f60:
    fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
              (ctx,(unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
                    *)local_a8,op,pb,&local_e8);
switchD_005f3a5d_default:
    std::
    _Hashtable<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_baryonyx::itm::merged_constraint_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_baryonyx::itm::merged_constraint_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_a8);
    local_a8._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_a8._8_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_98._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_e8.
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_e8.
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_e8.
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *)local_a8);
LAB_005f3fea:
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector(&local_e8);
    improve_memory_usage(__return_storage_ptr__);
    goto switchD_005f39c5_default;
  case p1:
  case p2:
  case p3:
  case p4:
    local_c8 = __return_storage_ptr__;
    make_unsorted_merged_constraints(&local_c0,ctx,pb);
    local_e8.
    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_e8.
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_a8,
               ((long)(pb->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pb->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
               (value_type_conflict3 *)&local_e8,(allocator_type *)&local_70);
    for (pmVar10 = local_c0.
                   super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pmVar10 !=
        local_c0.
        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ._M_impl.super__Vector_impl_data._M_finish; pmVar10 = pmVar10 + 1) {
      pfVar2 = (pmVar10->elements).
               super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pfVar19 = (pmVar10->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl.super__Vector_impl_data._M_start; pfVar19 != pfVar2;
          pfVar19 = pfVar19 + 1) {
        *(int *)(local_a8._0_8_ + (long)pfVar19->variable_index * 4) =
             *(int *)(local_a8._0_8_ + (long)pfVar19->variable_index * 4) + 1;
      }
    }
    local_70.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_e8,
               ((long)(pb->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pb->vars).values.
                      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
               (value_type_conflict2 *)&local_70,&local_e9);
    poVar3 = (pb->objective).elements.
             super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (poVar11 = (pb->objective).elements.
                   super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                   ._M_impl.super__Vector_impl_data._M_start; poVar11 != poVar3;
        poVar11 = poVar11 + 1) {
      (&((local_e8.
          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          ._M_impl.super__Vector_impl_data._M_start)->elements).
        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>.
        _M_impl.super__Vector_impl_data._M_start)[poVar11->variable_index] =
           (pointer)(poVar11->factor /
                    (double)*(int *)(local_a8._0_8_ + (long)poVar11->variable_index * 4));
    }
    local_48 = pb;
    local_40 = ctx;
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
              (&local_70,
               ((long)local_c0.
                      super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_c0.
                      super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
               (allocator_type *)&local_e9);
    ppVar15 = local_70.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar13 = (int)((ulong)((long)local_c0.
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_c0.
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (uVar13 != 0) {
      uVar22 = 0;
      do {
        pfVar2 = local_c0.
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar22].elements.
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pfVar19 = (&((local_e8.
                      super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      ._M_impl.super__Vector_impl_data._M_start)->elements).
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl.super__Vector_impl_data._M_start)[pfVar2->variable_index];
        auVar28 = ZEXT864(pfVar19);
        local_70.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start[uVar22].first = (int)uVar22;
        local_70.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start[uVar22].second = (double)pfVar19;
        uVar17 = (long)local_c0.
                       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar22].elements.
                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar2;
        if ((uVar17 & 0x7fffffff8) != 8) {
          lVar27 = 0;
          do {
            auVar29._8_8_ = 0;
            auVar29._0_8_ =
                 (&((local_e8.
                     super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                     ._M_impl.super__Vector_impl_data._M_start)->elements).
                   super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                   ._M_impl.super__Vector_impl_data._M_start)[pfVar2[lVar27 + 1].variable_index];
            auVar29 = vminsd_avx(auVar29,auVar28._0_16_);
            auVar28 = ZEXT1664(auVar29);
            local_70.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar22].second = auVar29._0_8_;
            lVar27 = lVar27 + 1;
          } while ((uVar17 >> 3 & 0xffffffff) - 1 != lVar27);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar13);
    }
    if (*arg1 == p1) {
      if (local_70.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_70.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        lVar27 = (long)local_70.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_70.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
                  (local_70.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_70.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar27 >> 4) * 2 ^ 0x7e);
        if (lVar27 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
                    (ppVar15,local_70.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        else {
          ppVar18 = ppVar15 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__0>>
                    (ppVar15,ppVar18);
          if (ppVar18 !=
              local_70.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pdVar25 = &ppVar15[0x10].second;
            do {
              iVar1 = ppVar18->first;
              dVar5 = ppVar18->second;
              dVar6 = ppVar18[-1].second;
              ppVar15 = ppVar18;
              pdVar9 = pdVar25;
              if (dVar6 < dVar5) {
                do {
                  pdVar14 = pdVar9;
                  ((pair<int,_double> *)(pdVar14 + -1))->first = *(int *)(pdVar14 + -3);
                  *pdVar14 = dVar6;
                  dVar6 = pdVar14[-4];
                  pdVar9 = pdVar14 + -2;
                } while (dVar6 < dVar5);
                ppVar15 = (pointer)(pdVar14 + -3);
              }
              ppVar15->first = iVar1;
              ppVar15->second = dVar5;
              ppVar18 = ppVar18 + 1;
              pdVar25 = pdVar25 + 2;
            } while (ppVar18 !=
                     local_70.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
      }
    }
    else if (local_70.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             local_70.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
      lVar27 = (long)local_70.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_70.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__1>>
                (local_70.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_70.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar27 >> 4) * 2 ^ 0x7e);
      if (lVar27 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__1>>
                  (ppVar15,local_70.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        ppVar18 = ppVar15 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__1>>
                  (ppVar15,ppVar18);
        if (ppVar18 !=
            local_70.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pdVar25 = &ppVar15[0x10].second;
          do {
            iVar1 = ppVar18->first;
            dVar5 = ppVar18->second;
            dVar6 = ppVar18[-1].second;
            ppVar15 = ppVar18;
            pdVar9 = pdVar25;
            if (dVar5 < dVar6) {
              do {
                pdVar14 = pdVar9;
                ((pair<int,_double> *)(pdVar14 + -1))->first = *(int *)(pdVar14 + -3);
                *pdVar14 = dVar6;
                dVar6 = pdVar14[-4];
                pdVar9 = pdVar14 + -2;
              } while (dVar5 < dVar6);
              ppVar15 = (pointer)(pdVar14 + -3);
            }
            ppVar15->first = iVar1;
            ppVar15->second = dVar5;
            ppVar18 = ppVar18 + 1;
            pdVar25 = pdVar25 + 2;
          } while (ppVar18 !=
                   local_70.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
    }
    pmVar8 = local_c0.
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pmVar10 = local_c0.
              super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar27 = (long)local_c0.
                   super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_c0.
                   super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar22 = (lVar27 >> 3) * -0x3333333333333333;
    uVar17 = uVar22 & 0xffffffff;
    if (uVar17 != 0) {
      piVar20 = &(local_c0.
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  ._M_impl.super__Vector_impl_data._M_start)->id;
      lVar23 = 0;
      do {
        *piVar20 = *(int *)((long)&(local_70.
                                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->first + lVar23);
        lVar23 = lVar23 + 0x10;
        piVar20 = piVar20 + 10;
      } while (uVar17 * 0x10 != lVar23);
    }
    if (local_c0.
        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c0.
        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__2>>
                (local_c0.
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_c0.
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(int)LZCOUNT(uVar22) * 2 ^ 0x7e);
      if (lVar27 < 0x281) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__2>>
                  (pmVar10,pmVar8);
      }
      else {
        pmVar26 = pmVar10 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__2>>
                  (pmVar10,pmVar26);
        for (; pmVar26 != pmVar8; pmVar26 = pmVar26 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<baryonyx::itm::merged_constraint*,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>,__gnu_cxx::__ops::_Val_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__2>>
                    (pmVar26);
        }
      }
    }
    auVar29 = in_ZMM2._0_16_;
    uVar13 = (int)((ulong)((long)local_c0.
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_c0.
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (uVar13 != 0) {
      uVar22 = 0;
      do {
        __first._M_current =
             local_c0.
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar22].elements.
             super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
             ._M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             local_c0.
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar22].elements.
             super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__first._M_current != __last._M_current) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::function_element*,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__3>>
                    (__first,__last,
                     (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current
                                                >> 3) * 2) ^ 0x7e,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_merged_constraint_cpp:278:19)>
                      )&local_e8);
          if ((long)__last._M_current - (long)__first._M_current < 0x81) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::function_element*,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__3>>
                      (__first,__last,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_merged_constraint_cpp:278:19)>
                        )&local_e8);
          }
          else {
            __last_00._M_current = __first._M_current + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::function_element*,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::make_special_merged_constraints(baryonyx::context_const&,baryonyx::problem_const&)::__3>>
                      (__first,__last_00,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quesnel[P]baryonyx_lib_src_merged_constraint_cpp:278:19)>
                        )&local_e8);
            for (; __last_00._M_current != __last._M_current;
                __last_00._M_current = __last_00._M_current + 1) {
              fVar4 = *__last_00._M_current;
              lVar27 = (long)fVar4 >> 0x20;
              pfVar16 = __last_00._M_current;
              pfVar21 = __last_00._M_current;
              if ((double)(&((local_e8.
                              super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                              ._M_impl.super__Vector_impl_data._M_start)->elements).
                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                            ._M_impl.super__Vector_impl_data._M_start)
                          [__last_00._M_current[-1].variable_index] <
                  (double)(&((local_e8.
                              super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                              ._M_impl.super__Vector_impl_data._M_start)->elements).
                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                            ._M_impl.super__Vector_impl_data._M_start)[lVar27]) {
                do {
                  pfVar16 = pfVar21 + -1;
                  *pfVar21 = pfVar21[-1];
                  pfVar7 = pfVar21 + -2;
                  pfVar21 = pfVar16;
                } while ((double)(&((local_e8.
                                     super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->elements).
                                   super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                   ._M_impl.super__Vector_impl_data._M_start)
                                 [pfVar7->variable_index] <
                         (double)(&((local_e8.
                                     super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->elements).
                                   super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                   ._M_impl.super__Vector_impl_data._M_start)[lVar27]);
              }
              *pfVar16 = fVar4;
            }
          }
        }
        auVar29 = in_ZMM2._0_16_;
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar13);
    }
    if (local_70.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.
                            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    ctx = local_40;
    pb = local_48;
    __return_storage_ptr__ = local_c8;
    if (local_e8.
        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.
                      super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a8._0_8_,local_98._0_8_ - local_a8._0_8_);
    }
    local_a8._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_a8._8_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_98._0_8_ =
         (__return_storage_ptr__->
         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    this = &local_c0;
    break;
  default:
    goto switchD_005f39c5_default;
  }
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (this->
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       (this->
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  ~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           *)local_a8);
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  ~vector(this);
switchD_005f39c5_default:
  local_e8.
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_e8.
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         (int)((ulong)((long)(__return_storage_ptr__->
                                             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(__return_storage_ptr__->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         0x33333333 + (int)local_38);
  sVar12 = memory_consumed(pb);
  auVar29 = vcvtusi2sd_avx512f(auVar29,sVar12);
  local_50 = auVar29._0_8_;
  dVar5 = local_50 * 0.0009765625;
  dVar6 = dVar5 * 0.0009765625;
  if (dVar6 * 0.0009765625 <= 0.5) {
    if (dVar6 <= 0.5) {
      if (dVar5 <= 0.5) {
        local_58[0] = 3;
      }
      else {
        local_58[0] = 2;
        local_50 = dVar5;
      }
    }
    else {
      local_58[0] = 1;
      local_50 = dVar6;
    }
  }
  else {
    local_58[0] = 0;
    local_50 = dVar6 * 0.0009765625;
  }
  to_string_abi_cxx11_((string *)local_a8,(baryonyx *)local_58,mem);
  info<int,std::__cxx11::string>
            (ctx,"  - merged constraints removed: {}\n  - problem memory used: {}\n",
             (int *)&local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  if ((pointer)local_a8._0_8_ != (pointer)local_98) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<merged_constraint>
make_merged_constraints(const context& ctx, const problem& pb)
{
    info(ctx,
         "  - merge constraint according to the `{}` algorithm\n",
         ctx.parameters.pre_order);

    auto original_nb = static_cast<int>(pb.equal_constraints.size() +
                                        pb.less_constraints.size() +
                                        pb.greater_constraints.size());

    std::vector<merged_constraint> ret;
    ret.reserve(original_nb);

    switch (ctx.parameters.pre_order) {
    case solver_parameters::pre_constraint_order::none:
        ret = make_unsorted_merged_constraints(ctx, pb);
        break;
    case solver_parameters::pre_constraint_order::memory:
        ret = make_unsorted_merged_constraints(ctx, pb);
        improve_memory_usage(ret);
        break;
    case solver_parameters::pre_constraint_order::less_greater_equal:
    case solver_parameters::pre_constraint_order::less_equal_greater:
    case solver_parameters::pre_constraint_order::greater_less_equal:
    case solver_parameters::pre_constraint_order::greater_equal_less:
    case solver_parameters::pre_constraint_order::equal_less_greater:
    case solver_parameters::pre_constraint_order::equal_greater_less:
        ret = make_ordered_merged_constraints(ctx, pb);
        improve_memory_usage(ret);
        break;
    case solver_parameters::pre_constraint_order::p1:
    case solver_parameters::pre_constraint_order::p2:
    case solver_parameters::pre_constraint_order::p3:
    case solver_parameters::pre_constraint_order::p4:
        ret = make_special_merged_constraints(ctx, pb);
        break;
    }

    info(ctx,
         "  - merged constraints removed: {}\n"
         "  - problem memory used: {}\n",
         original_nb - static_cast<int>(ret.size()),
         to_string(memory_consumed_size(memory_consumed(pb))));

    return ret;
}